

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow *window,ImGuiAxis axis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  ImRect IVar12;
  
  fVar1 = (window->Pos).x;
  fVar2 = (window->Pos).y;
  fVar6 = (window->Size).x + fVar1;
  fVar11 = (window->Size).y + fVar2;
  fVar8 = (window->InnerRect).Min.x;
  fVar10 = (window->InnerRect).Min.y;
  fVar9 = (window->InnerRect).Max.x;
  fVar3 = (window->InnerRect).Max.y;
  fVar4 = window->WindowBorderSize;
  if (1 < (uint)axis) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui.h"
                ,0xe0,"operator[]","ImGui ASSERT FAILED: %s","idx <= 1");
  }
  fVar7 = (&(window->ScrollbarSizes).x)[axis ^ ImGuiAxis_Y];
  if (fVar7 <= 0.0) {
    LogFatalMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/ImGui/imgui_widgets.cpp"
                ,0x33c,"GetWindowScrollbarRect","ImGui ASSERT FAILED: %s","scrollbar_size > 0.0f");
  }
  if (axis == ImGuiAxis_X) {
    fVar7 = (fVar11 - fVar4) - fVar7;
    uVar5 = -(uint)(fVar7 <= fVar2);
    fVar10 = (float)(uVar5 & (uint)fVar2 | ~uVar5 & (uint)fVar7);
  }
  else {
    fVar7 = (fVar6 - fVar4) - fVar7;
    uVar5 = -(uint)(fVar7 <= fVar1);
    fVar8 = (float)(uVar5 & (uint)fVar1 | ~uVar5 & (uint)fVar7);
    fVar9 = fVar6;
    fVar11 = fVar3;
  }
  IVar12.Min.y = fVar10;
  IVar12.Min.x = fVar8;
  IVar12.Max.y = fVar11;
  IVar12.Max.x = fVar9;
  return IVar12;
}

Assistant:

ImRect ImGui::GetWindowScrollbarRect(ImGuiWindow* window, ImGuiAxis axis)
{
    const ImRect outer_rect = window->Rect();
    const ImRect inner_rect = window->InnerRect;
    const float border_size = window->WindowBorderSize;
    const float scrollbar_size = window->ScrollbarSizes[axis ^ 1]; // (ScrollbarSizes.x = width of Y scrollbar; ScrollbarSizes.y = height of X scrollbar)
    IM_ASSERT(scrollbar_size > 0.0f);
    if (axis == ImGuiAxis_X)
        return ImRect(inner_rect.Min.x, ImMax(outer_rect.Min.y, outer_rect.Max.y - border_size - scrollbar_size), inner_rect.Max.x, outer_rect.Max.y);
    else
        return ImRect(ImMax(outer_rect.Min.x, outer_rect.Max.x - border_size - scrollbar_size), inner_rect.Min.y, outer_rect.Max.x, inner_rect.Max.y);
}